

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_power_udev.c
# Opt level: O1

int gsc_set_device_power_control(char *devpath,uint8_t power_control)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  igsc_log_func_t p_Var6;
  char *pcVar7;
  undefined8 uVar8;
  undefined7 in_register_00000031;
  char *pcVar9;
  long in_FS_OFFSET;
  char __time_buf_2 [128];
  stat st;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 uVar10;
  char local_148 [128];
  stat local_c8;
  long local_38;
  
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (int)CONCAT71(in_register_00000031,power_control);
  if (iVar1 == 1) {
    pcVar9 = "on";
  }
  else {
    if (iVar1 != 2) {
      p_Var6 = igsc_get_log_callback_func();
      if (p_Var6 == (igsc_log_func_t)0x0) {
        pcVar9 = gsc_time((char *)&local_c8,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Wrong power control %u\n",pcVar9,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
               ,"gsc_set_device_power_control",0x66,CONCAT44(uVar10,iVar1));
      }
      else {
        p_Var6 = igsc_get_log_callback_func();
        pcVar9 = gsc_time((char *)&local_c8,0x80);
        (*p_Var6)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Wrong power control %u\n",pcVar9,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                  ,"gsc_set_device_power_control",0x66,CONCAT44(uVar10,iVar1));
      }
      iVar1 = 1;
      goto LAB_0011ecff;
    }
    pcVar9 = "auto";
  }
  lVar3 = udev_new();
  if (lVar3 == 0) {
    p_Var6 = igsc_get_log_callback_func();
    if (p_Var6 == (igsc_log_func_t)0x0) {
      pcVar9 = gsc_time((char *)&local_c8,0x80);
      syslog(3,"%s: IGSC: (%s:%s():%d) Cannot create udev\n",pcVar9,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
             ,"gsc_set_device_power_control",0x6d);
    }
    else {
      p_Var6 = igsc_get_log_callback_func();
      pcVar9 = gsc_time((char *)&local_c8,0x80);
      (*p_Var6)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot create udev\n",pcVar9,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                ,"gsc_set_device_power_control",0x6d);
    }
    iVar1 = 2;
    goto LAB_0011ecff;
  }
  iVar1 = lstat(devpath,&local_c8);
  if (iVar1 < 0) {
    p_Var6 = igsc_get_log_callback_func();
    if (p_Var6 != (igsc_log_func_t)0x0) {
      p_Var6 = igsc_get_log_callback_func();
      pcVar9 = gsc_time(local_148,0x80);
      pcVar7 = "%s: IGSC: (%s:%s():%d) Cannot lstat %s\n";
      lVar4 = 0;
      uVar8 = 0x73;
      goto LAB_0011ebc1;
    }
    pcVar9 = gsc_time(local_148,0x80);
    pcVar7 = "%s: IGSC: (%s:%s():%d) Cannot lstat %s\n";
    lVar4 = 0;
    uVar8 = 0x73;
LAB_0011ece3:
    syslog(3,pcVar7,pcVar9,
           "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
           ,"gsc_set_device_power_control",uVar8,devpath);
LAB_0011ecea:
    iVar1 = 1;
  }
  else {
    lVar4 = udev_device_new_from_devnum(lVar3,99,local_c8.st_rdev);
    if (lVar4 == 0) {
      p_Var6 = igsc_get_log_callback_func();
      if (p_Var6 == (igsc_log_func_t)0x0) {
        pcVar9 = gsc_time(local_148,0x80);
        pcVar7 = "%s: IGSC: (%s:%s():%d) Cannot create device for %s\n";
        lVar4 = 0;
        uVar8 = 0x7b;
        goto LAB_0011ece3;
      }
      p_Var6 = igsc_get_log_callback_func();
      pcVar9 = gsc_time(local_148,0x80);
      pcVar7 = "%s: IGSC: (%s:%s():%d) Cannot create device for %s\n";
      lVar4 = 0;
      uVar8 = 0x7b;
LAB_0011ebc1:
      (*p_Var6)(IGSC_LOG_LEVEL_ERROR,pcVar7,pcVar9,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                ,"gsc_set_device_power_control",uVar8,devpath);
      goto LAB_0011ecea;
    }
    lVar5 = udev_device_get_parent_with_subsystem_devtype(lVar4,"pci",0);
    if (lVar5 == 0) {
      p_Var6 = igsc_get_log_callback_func();
      if (p_Var6 == (igsc_log_func_t)0x0) {
        pcVar9 = gsc_time(local_148,0x80);
        devpath = (char *)udev_device_get_sysname(lVar4);
        pcVar7 = "%s: IGSC: (%s:%s():%d) Can\'t find device parent for \'%s\'\n";
        uVar8 = 0x84;
        goto LAB_0011ece3;
      }
      p_Var6 = igsc_get_log_callback_func();
      pcVar9 = gsc_time(local_148,0x80);
      devpath = (char *)udev_device_get_sysname();
      pcVar7 = "%s: IGSC: (%s:%s():%d) Can\'t find device parent for \'%s\'\n";
      uVar8 = 0x84;
      goto LAB_0011ebc1;
    }
    iVar1 = udev_device_set_sysattr_value(lVar5,"power/control",pcVar9);
    if (iVar1 < 0) {
      p_Var6 = igsc_get_log_callback_func();
      if (p_Var6 == (igsc_log_func_t)0x0) {
        pcVar9 = gsc_time(local_148,0x80);
        devpath = (char *)udev_device_get_sysname(lVar5);
        pcVar7 = "%s: IGSC: (%s:%s():%d) failed to set power/control on %s %d\n";
        uVar8 = 0x8c;
        goto LAB_0011ece3;
      }
      p_Var6 = igsc_get_log_callback_func();
      pcVar9 = gsc_time(local_148,0x80);
      devpath = (char *)udev_device_get_sysname();
      pcVar7 = "%s: IGSC: (%s:%s():%d) failed to set power/control on %s %d\n";
      uVar8 = 0x8c;
      goto LAB_0011ebc1;
    }
    uVar2 = igsc_get_log_level();
    if (uVar2 != 0) {
      p_Var6 = igsc_get_log_callback_func();
      if (p_Var6 == (igsc_log_func_t)0x0) {
        pcVar7 = gsc_time(local_148,0x80);
        uVar8 = udev_device_get_sysname(lVar5);
        syslog(7,"%s: IGSC: (%s:%s():%d) power/control is set to %s on %s\n",pcVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
               ,"gsc_set_device_power_control",0x90,pcVar9,uVar8);
      }
      else {
        p_Var6 = igsc_get_log_callback_func();
        pcVar7 = gsc_time(local_148,0x80);
        uVar8 = udev_device_get_sysname(lVar5);
        (*p_Var6)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) power/control is set to %s on %s\n",
                  pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                  ,"gsc_set_device_power_control",0x90,pcVar9,uVar8);
      }
    }
  }
  udev_device_unref(lVar4);
  udev_unref(lVar3);
LAB_0011ecff:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int gsc_set_device_power_control(const char *devpath, uint8_t power_control)
{
    struct udev *udev = NULL;
    struct udev_device *dev = NULL;
    struct udev_device *parent;
    struct stat st;
    const char *val;
    int ret;

    switch (power_control)
    {
    case GSC_POWER_CONTROL_ON:
        val = "on";
        break;
    case GSC_POWER_CONTROL_AUTO:
        val = "auto";
        break;
    default:
        gsc_error("Wrong power control %u\n", power_control);
        return IGSC_ERROR_INTERNAL;
    }

    udev = udev_new();
    if (udev == NULL)
    {
        gsc_error("Cannot create udev\n");
        return IGSC_ERROR_NOMEM;
    }

    if (lstat(devpath, &st) < 0)
    {
        gsc_error("Cannot lstat %s\n", devpath);
        ret = IGSC_ERROR_INTERNAL;
        goto out;
    }

    dev = udev_device_new_from_devnum(udev, 'c', st.st_rdev);
    if (dev == NULL)
    {
        gsc_error("Cannot create device for %s\n", devpath);
        ret = IGSC_ERROR_INTERNAL;
        goto out;
    }

    /* Look for the GFX PCI parent */
    parent = udev_device_get_parent_with_subsystem_devtype(dev, "pci", NULL);
    if (parent == NULL)
    {
        gsc_error("Can't find device parent for '%s'\n", udev_device_get_sysname(dev));
        ret = IGSC_ERROR_INTERNAL;
        goto out;
    }

    ret = udev_device_set_sysattr_value(parent, "power/control", (char *)val);
    if (ret < 0)
    {
        gsc_error("failed to set power/control on %s %d\n", udev_device_get_sysname(parent), ret);
        ret = IGSC_ERROR_INTERNAL;
        goto out;
    }
    gsc_debug("power/control is set to %s on %s\n", val, udev_device_get_sysname(parent));

out:
    udev_device_unref(dev);
    udev_unref(udev);
    return ret;
}